

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_encoder_impl.cc
# Opt level: O2

bool __thiscall
draco::MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder>::
EncodeConnectivityFromCorner
          (MeshEdgebreakerEncoderImpl<draco::MeshEdgebreakerTraversalEncoder> *this,
          CornerIndex corner_id)

{
  pointer *ppIVar1;
  MeshEdgebreakerTraversalEncoder *this_00;
  mapped_type mVar2;
  CornerIndex CVar3;
  const_reference cVar4;
  bool bVar5;
  CornerIndex CVar6;
  uint neighbor_face_id;
  ulong uVar7;
  mapped_type *pmVar8;
  pointer pIVar9;
  int iVar10;
  ulong __n;
  size_type __n_00;
  int iVar11;
  reference rVar12;
  value_type local_88;
  CornerIndex right_corner_id;
  int local_6c;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_68;
  vector<bool,_std::allocator<bool>_> *local_60;
  vector<bool,_std::allocator<bool>_> *local_58;
  vector<bool,_std::allocator<bool>_> *local_50;
  _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_48;
  ulong local_40;
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  *local_38;
  
  local_68 = &this->corner_traversal_stack_;
  pIVar9 = (this->corner_traversal_stack_).
           super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->corner_traversal_stack_).
      super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar9) {
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar9;
  }
  local_88.value_ = corner_id.value_;
  std::
  vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
  ::push_back(local_68,&local_88);
  uVar7 = ((long)(this->mesh_->faces_).vector_.
                 super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->mesh_->faces_).vector_.
                super__Vector_base<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>,_std::allocator<std::array<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_3UL>_>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0xc;
  local_60 = &this->visited_faces_;
  local_38 = &this->processed_connectivity_corners_;
  this_00 = &this->traversal_encoder_;
  local_58 = &this->visited_vertex_ids_;
  local_50 = &this->visited_holes_;
  local_48 = (_Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
              *)&this->face_to_split_symbol_map_;
  local_40 = uVar7 & 0xffffffff;
  if ((int)uVar7 < 1) {
    local_40 = 0;
  }
LAB_0013311d:
  do {
    pIVar9 = (this->corner_traversal_stack_).
             super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((this->corner_traversal_stack_).
        super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
        ._M_impl.super__Vector_impl_data._M_start == pIVar9) {
      return true;
    }
    local_88.value_ = pIVar9[-1].value_;
    if (local_88.value_ != 0xffffffff) {
      rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         (local_60,(ulong)local_88.value_ / 3);
      uVar7 = local_40 & 0xffffffff;
      if ((*rVar12._M_p & rVar12._M_mask) == 0) {
LAB_001331d6:
        iVar11 = (int)uVar7;
        uVar7 = (ulong)(iVar11 - 1);
        if (iVar11 != 0) {
          this->last_encoded_symbol_id_ = this->last_encoded_symbol_id_ + 1;
          __n = (ulong)local_88.value_ / 3;
          if (local_88.value_ == 0xffffffff) {
            __n = 0xffffffff;
          }
          rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](local_60,__n);
          *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
          std::
          vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
          ::push_back(local_38,&local_88);
          __n_00 = 0xffffffff;
          if ((ulong)local_88.value_ != 0xffffffff) {
            __n_00 = (size_type)
                     *(uint *)(*(long *)&(((this->corner_table_)._M_t.
                                           super___uniq_ptr_impl<draco::CornerTable,_std::default_delete<draco::CornerTable>_>
                                           ._M_t.
                                           super__Tuple_impl<0UL,_draco::CornerTable_*,_std::default_delete<draco::CornerTable>_>
                                           .super__Head_base<0UL,_draco::CornerTable_*,_false>.
                                          _M_head_impl)->corner_to_vertex_map_).vector_ +
                              (ulong)local_88.value_ * 4);
          }
          iVar11 = (this->vertex_hole_id_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[__n_00];
          cVar4 = std::vector<bool,_std::allocator<bool>_>::operator[](local_58,__n_00);
          if (!cVar4) {
            rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[](local_58,__n_00);
            *rVar12._M_p = *rVar12._M_p | rVar12._M_mask;
            if (iVar11 == -1) {
              MeshEdgebreakerTraversalEncoder::EncodeSymbol(this_00,TOPOLOGY_C);
              local_88.value_ = (uint)GetRightCorner(this,local_88.value_);
              goto LAB_001331d6;
            }
          }
          right_corner_id = GetRightCorner(this,local_88.value_);
          CVar6 = GetLeftCorner(this,local_88.value_);
          CVar3.value_ = right_corner_id.value_;
          neighbor_face_id = right_corner_id.value_ / 3;
          bVar5 = IsRightFaceVisited(this,(CornerIndex)local_88.value_);
          iVar10 = (int)__n;
          if (bVar5) {
            if (CVar3.value_ != 0xffffffff) {
              CheckAndStoreTopologySplitEvent
                        (this,this->last_encoded_symbol_id_,iVar10,RIGHT_FACE_EDGE,neighbor_face_id)
              ;
            }
            bVar5 = IsLeftFaceVisited(this,(CornerIndex)local_88.value_);
            if (bVar5) {
              if (CVar6.value_ != 0xffffffff) {
                CheckAndStoreTopologySplitEvent
                          (this,this->last_encoded_symbol_id_,iVar10,LEFT_FACE_EDGE,CVar6.value_ / 3
                          );
              }
              MeshEdgebreakerTraversalEncoder::EncodeSymbol(this_00,TOPOLOGY_E);
              ppIVar1 = &(this->corner_traversal_stack_).
                         super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
              *ppIVar1 = *ppIVar1 + -1;
              goto LAB_0013311d;
            }
            MeshEdgebreakerTraversalEncoder::EncodeSymbol(this_00,TOPOLOGY_R);
            local_88.value_ = CVar6.value_;
          }
          else {
            bVar5 = IsLeftFaceVisited(this,(CornerIndex)local_88.value_);
            if (!bVar5) {
              MeshEdgebreakerTraversalEncoder::EncodeSymbol(this_00,TOPOLOGY_S);
              this->num_split_symbols_ = this->num_split_symbols_ + 1;
              if ((iVar11 != -1) &&
                 (rVar12 = std::vector<bool,_std::allocator<bool>_>::operator[]
                                     (local_50,(long)(this->vertex_hole_id_).
                                                     super__Vector_base<int,_std::allocator<int>_>.
                                                     _M_impl.super__Vector_impl_data._M_start
                                                     [__n_00]), (*rVar12._M_p & rVar12._M_mask) == 0
                 )) {
                EncodeHole(this,(CornerIndex)local_88.value_,false);
              }
              mVar2 = this->last_encoded_symbol_id_;
              local_6c = iVar10;
              pmVar8 = std::__detail::
                       _Map_base<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                       ::operator[](local_48,&local_6c);
              *pmVar8 = mVar2;
              (this->corner_traversal_stack_).
              super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1].value_ = CVar6.value_;
              std::
              vector<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
              ::push_back(local_68,&right_corner_id);
              goto LAB_0013311d;
            }
            if (CVar6.value_ != 0xffffffff) {
              CheckAndStoreTopologySplitEvent
                        (this,this->last_encoded_symbol_id_,iVar10,LEFT_FACE_EDGE,CVar6.value_ / 3);
            }
            MeshEdgebreakerTraversalEncoder::EncodeSymbol(this_00,TOPOLOGY_L);
            local_88.value_ = right_corner_id.value_;
          }
          goto LAB_001331d6;
        }
        goto LAB_0013311d;
      }
      pIVar9 = (this->corner_traversal_stack_).
               super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    (this->corner_traversal_stack_).
    super__Vector_base<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::CornerIndex_tag_type_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar9 + -1;
  } while( true );
}

Assistant:

bool MeshEdgebreakerEncoderImpl<TraversalEncoder>::EncodeConnectivityFromCorner(
    CornerIndex corner_id) {
  corner_traversal_stack_.clear();
  corner_traversal_stack_.push_back(corner_id);
  const int num_faces = mesh_->num_faces();
  while (!corner_traversal_stack_.empty()) {
    // Currently processed corner.
    corner_id = corner_traversal_stack_.back();
    // Make sure the face hasn't been visited yet.
    if (corner_id == kInvalidCornerIndex ||
        visited_faces_[corner_table_->Face(corner_id).value()]) {
      // This face has been already traversed.
      corner_traversal_stack_.pop_back();
      continue;
    }
    int num_visited_faces = 0;
    while (num_visited_faces < num_faces) {
      // Mark the current face as visited.
      ++num_visited_faces;
      ++last_encoded_symbol_id_;

      const FaceIndex face_id = corner_table_->Face(corner_id);
      visited_faces_[face_id.value()] = true;
      processed_connectivity_corners_.push_back(corner_id);
      traversal_encoder_.NewCornerReached(corner_id);
      const VertexIndex vert_id = corner_table_->Vertex(corner_id);
      const bool on_boundary = (vertex_hole_id_[vert_id.value()] != -1);
      if (!IsVertexVisited(vert_id)) {
        // A new unvisited vertex has been reached. We need to store its
        // position difference using next, prev, and opposite vertices.
        visited_vertex_ids_[vert_id.value()] = true;
        if (!on_boundary) {
          // If the vertex is on boundary it must correspond to an unvisited
          // hole and it will be encoded with TOPOLOGY_S symbol later).
          traversal_encoder_.EncodeSymbol(TOPOLOGY_C);
          // Move to the right triangle.
          corner_id = GetRightCorner(corner_id);
          continue;
        }
      }
      // The current vertex has been already visited or it was on a boundary.
      // We need to determine whether we can visit any of it's neighboring
      // faces.
      const CornerIndex right_corner_id = GetRightCorner(corner_id);
      const CornerIndex left_corner_id = GetLeftCorner(corner_id);
      const FaceIndex right_face_id = corner_table_->Face(right_corner_id);
      const FaceIndex left_face_id = corner_table_->Face(left_corner_id);
      if (IsRightFaceVisited(corner_id)) {
        // Right face has been already visited.
        // Check whether there is a topology split event.
        if (right_face_id != kInvalidFaceIndex) {
          CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                          face_id.value(), RIGHT_FACE_EDGE,
                                          right_face_id.value());
        }
        if (IsLeftFaceVisited(corner_id)) {
          // Both neighboring faces are visited. End reached.
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_E);
          corner_traversal_stack_.pop_back();
          break;  // Break from the while (num_visited_faces < num_faces) loop.
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_R);
          // Go to the left face.
          corner_id = left_corner_id;
        }
      } else {
        // Right face was not visited.
        if (IsLeftFaceVisited(corner_id)) {
          // Check whether there is a topology split event on the left face.
          if (left_face_id != kInvalidFaceIndex) {
            CheckAndStoreTopologySplitEvent(last_encoded_symbol_id_,
                                            face_id.value(), LEFT_FACE_EDGE,
                                            left_face_id.value());
          }
          traversal_encoder_.EncodeSymbol(TOPOLOGY_L);
          // Left face visited, go to the right one.
          corner_id = right_corner_id;
        } else {
          traversal_encoder_.EncodeSymbol(TOPOLOGY_S);
          ++num_split_symbols_;
          // Both neighboring faces are unvisited, we need to visit both of
          // them.
          if (on_boundary) {
            // The tip vertex is on a hole boundary. If the hole hasn't been
            // visited yet we need to encode it.
            const int hole_id = vertex_hole_id_[vert_id.value()];
            if (!visited_holes_[hole_id]) {
              EncodeHole(corner_id, false);
            }
          }
          face_to_split_symbol_map_[face_id.value()] = last_encoded_symbol_id_;
          // Split the traversal.
          // First make the top of the current corner stack point to the left
          // face (this one will be processed second).
          corner_traversal_stack_.back() = left_corner_id;
          // Add a new corner to the top of the stack (right face needs to
          // be traversed first).
          corner_traversal_stack_.push_back(right_corner_id);
          // Break from the while (num_visited_faces < num_faces) loop.
          break;
        }
      }
    }
  }
  return true;  // All corners have been processed.
}